

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O0

void __thiscall vec<Lit>::moveTo(vec<Lit> *this,vec<Lit> *dest)

{
  vec<Lit> *in_RSI;
  uint *in_RDI;
  
  clear(in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  in_RSI->data = *(Lit **)(in_RDI + 2);
  in_RSI->sz = *in_RDI;
  in_RSI->cap = in_RDI[1];
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  *in_RDI = 0;
  in_RDI[1] = 0;
  return;
}

Assistant:

void moveTo(vec<T>& dest) {
		dest.clear(true);
		dest.data = data;
		dest.sz = sz;
		dest.cap = cap;
		data = nullptr;
		sz = 0;
		cap = 0;
	}